

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void PerfomanceTester<int,_void>::Test(void)

{
  NoAction<int>();
  Int2StrConvert<int>();
  BoostLexicalCastOnStack<int>();
  SpiritKarma<int>();
  StdSprintf<int>();
  StdStringStreamWithRewind<int>();
  return;
}

Assistant:

static void Test()
    {
        NoAction<T>();
        Int2StrConvert<T>();
#ifdef USE_BOOST
        BoostLexicalCastOnStack<T>();
        SpiritKarma<T>();
#endif
        StdSprintf<T>();
        StdStringStreamWithRewind<T>();
    }